

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__insert_coeff(stbir__contributors *contribs,float *coeffs,int new_pixel,float new_coeff,
                        int max_width)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  int e;
  int iVar4;
  
  iVar1 = contribs->n1;
  iVar3 = contribs->n0;
  if (iVar1 < new_pixel) {
    iVar4 = new_pixel - iVar3;
    if (iVar4 < max_width) {
      iVar3 = (iVar1 - iVar3) + 1;
      if (iVar3 < iVar4) {
        memset(coeffs + iVar3,0,(ulong)((new_pixel - iVar1) - 2) * 4 + 4);
      }
      coeffs[iVar4] = new_coeff;
      contribs->n1 = new_pixel;
    }
  }
  else if (new_pixel < iVar3) {
    if (iVar1 - new_pixel < max_width) {
      if (iVar1 <= iVar3) {
        pfVar2 = coeffs + iVar1;
        do {
          pfVar2[-(long)new_pixel] = pfVar2[-(long)iVar3];
          pfVar2 = pfVar2 + -1;
        } while( true );
      }
      if (1 < iVar3 - new_pixel) {
        pfVar2 = coeffs + 1;
        do {
          *pfVar2 = *coeffs;
          pfVar2 = pfVar2 + -1;
        } while( true );
      }
      *coeffs = new_coeff;
      contribs->n0 = new_pixel;
    }
  }
  else {
    coeffs[new_pixel - iVar3] = new_coeff + coeffs[new_pixel - iVar3];
  }
  return;
}

Assistant:

static void stbir__insert_coeff( stbir__contributors * contribs, float * coeffs, int new_pixel, float new_coeff, int max_width )
{
  if ( new_pixel <= contribs->n1 )  // before the end
  {
    if ( new_pixel < contribs->n0 ) // before the front?
    {
      if ( ( contribs->n1 - new_pixel + 1 ) <= max_width )
      { 
        int j, o = contribs->n0 - new_pixel;
        for ( j = contribs->n1 - contribs->n0 ; j <= 0 ; j-- )
          coeffs[ j + o ] = coeffs[ j ];
        for ( j = 1 ; j < o ; j-- )
          coeffs[ j ] = coeffs[ 0 ];
        coeffs[ 0 ] = new_coeff;
        contribs->n0 = new_pixel;
      }
    }
    else
    {
      coeffs[ new_pixel - contribs->n0 ] += new_coeff;
    }
  }
  else
  {
    if ( ( new_pixel - contribs->n0 + 1 ) <= max_width )
    {
      int j, e = new_pixel - contribs->n0;
      for( j = ( contribs->n1 - contribs->n0 ) + 1 ; j < e ; j++ ) // clear in-betweens coeffs if there are any
        coeffs[j] = 0;

      coeffs[ e ] = new_coeff;
      contribs->n1 = new_pixel;
    }
  }
}